

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_er_gen_1(m68k_info *info,_Bool isDreg,int opcode,uint8_t size)

{
  m68k_info *info_00;
  byte in_SIL;
  long in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  m68k_op_mem *op;
  m68k_info *in_stack_ffffffffffffffe0;
  
  info_00 = (m68k_info *)
            build_init_op(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                          (int)in_stack_ffffffffffffffd8,
                          (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  op = &(info_00->extension).operands[0].mem;
  get_ea_mode_op(info_00,(cs_m68k_op *)op,(uint)((ulong)info_00 >> 0x20),(uint)info_00);
  if ((in_SIL & 1) == 0) {
    ((m68k_op_br_disp *)(op + 1))[3].disp = 2;
    op->base_reg = (*(uint *)(in_RDI + 0x24) >> 9 & 7) + M68K_REG_A0;
  }
  else {
    ((m68k_op_br_disp *)(op + 1))[3].disp = 1;
    op->base_reg = (*(uint *)(in_RDI + 0x24) >> 9 & 7) + M68K_REG_D0;
  }
  return;
}

Assistant:

static void build_er_gen_1(m68k_info *info, bool isDreg, int opcode, uint8_t size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, size);

	if (isDreg) {
		op1->address_mode = M68K_AM_REG_DIRECT_DATA;
		op1->reg = M68K_REG_D0 + ((info->ir >> 9) & 7);
	} else {
		op1->address_mode = M68K_AM_REG_DIRECT_ADDR;
		op1->reg = M68K_REG_A0 + ((info->ir >> 9) & 7);
	}
}